

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

void HTS_Engine_save_generated_speech(HTS_Engine *engine,FILE *fp)

{
  undefined8 in_RAX;
  size_t sVar1;
  ulong sample_index;
  double dVar2;
  undefined6 uStack_38;
  short temp;
  
  sample_index = 0;
  _uStack_38 = in_RAX;
  while( true ) {
    sVar1 = HTS_GStreamSet_get_total_nsamples(&engine->gss);
    if (sVar1 <= sample_index) break;
    dVar2 = HTS_GStreamSet_get_speech(&engine->gss,sample_index);
    if (dVar2 <= 32767.0) {
      if (-32768.0 <= dVar2) {
        _uStack_38 = CONCAT26((short)(int)dVar2,uStack_38);
      }
      else {
        _uStack_38 = CONCAT26(0x8000,uStack_38);
      }
    }
    else {
      _uStack_38 = CONCAT26(0x7fff,uStack_38);
    }
    fwrite(&temp,2,1,(FILE *)fp);
    sample_index = sample_index + 1;
  }
  return;
}

Assistant:

void HTS_Engine_save_generated_speech(HTS_Engine * engine, FILE * fp)
{
   size_t i;
   double x;
   short temp;
   HTS_GStreamSet *gss = &engine->gss;

   for (i = 0; i < HTS_GStreamSet_get_total_nsamples(gss); i++) {
      x = HTS_GStreamSet_get_speech(gss, i);
      if (x > 32767.0)
         temp = 32767;
      else if (x < -32768.0)
         temp = -32768;
      else
         temp = (short) x;
      fwrite(&temp, sizeof(short), 1, fp);
   }
}